

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackageExportAllDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageExportAllDeclarationSyntax,slang::syntax::PackageExportAllDeclarationSyntax_const&>
          (BumpAllocator *this,PackageExportAllDeclarationSyntax *args)

{
  PackageExportAllDeclarationSyntax *pPVar1;
  PackageExportAllDeclarationSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pPVar1 = (PackageExportAllDeclarationSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI)
  ;
  slang::syntax::PackageExportAllDeclarationSyntax::PackageExportAllDeclarationSyntax(in_RSI,pPVar1)
  ;
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }